

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O3

Literal * Saturation::ExtensionalityClauseContainer::getSingleVarEq(Clause *c)

{
  Literal *pLVar1;
  uint i;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    pLVar1 = c->_literals[lVar2];
    if ((*(int *)&(pLVar1->super_Term).field_0xc < 0) &&
       (((pLVar1->super_Term)._args[0]._content & 4) != 0)) break;
    lVar2 = lVar2 + 1;
  }
  return pLVar1;
}

Assistant:

Literal* ExtensionalityClauseContainer::getSingleVarEq(Clause* c) {
  for (unsigned i = 0; i < c->length(); ++i) {
    Literal* varEq = (*c)[i];
    if (varEq->isTwoVarEquality() && varEq->isPositive()) {
      return varEq;
      break;
    }
  }
  ASSERTION_VIOLATION;
}